

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O1

void P_DaggerAlert(AActor *target,AActor *emitter)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  sector_t *psVar4;
  bool bVar5;
  FState *newstate;
  AActor *pAVar6;
  FSoundID local_34;
  FName local_30;
  FName local_2c;
  
  psVar4 = emitter->Sector;
  pAVar6 = (emitter->LastHeard).field_0.p;
  if (pAVar6 != (AActor *)0x0) {
    if (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      return;
    }
    (emitter->LastHeard).field_0.p = (AActor *)0x0;
  }
  if (((0 < emitter->health) && (((emitter->flags3).Value & 0x2000) != 0)) &&
     (uVar2 = (emitter->flags4).Value, -1 < (short)uVar2)) {
    (emitter->flags4).Value = uVar2 | 0x8000;
    (emitter->target).field_0.p = target;
    local_2c.Index = 0x88;
    local_30.Index = 0xbe;
    newstate = AActor::FindState(emitter,&local_2c,&local_30,false);
    if (newstate != (FState *)0x0) {
      AActor::SetState(emitter,newstate,false);
    }
    pAVar6 = psVar4->thinglist;
    if (pAVar6 != (AActor *)0x0) {
      do {
        if (((pAVar6 != target && pAVar6 != emitter) && (0 < pAVar6->health)) &&
           ((((pAVar6->flags4).Value & 0xc000) == 0x4000 &&
            ((bVar5 = P_CheckSight(pAVar6,target,0), bVar5 ||
             (bVar5 = P_CheckSight(pAVar6,emitter,0), bVar5)))))) {
          (pAVar6->target).field_0.p = target;
          iVar3 = (pAVar6->SeeSound).super_FSoundID.ID;
          if (iVar3 != 0) {
            local_34.ID = iVar3;
            S_Sound(pAVar6,2,&local_34,1.0,1.0);
          }
          AActor::SetState(pAVar6,pAVar6->SeeState,false);
          pbVar1 = (byte *)((long)&(pAVar6->flags4).Value + 1);
          *pbVar1 = *pbVar1 | 0x80;
        }
        pAVar6 = pAVar6->snext;
      } while (pAVar6 != (AActor *)0x0);
    }
  }
  return;
}

Assistant:

void P_DaggerAlert(AActor *target, AActor *emitter)
{
	AActor *looker;
	sector_t *sec = emitter->Sector;

	if (emitter->LastHeard != NULL)
		return;
	if (emitter->health <= 0)
		return;
	if (!(emitter->flags3 & MF3_ISMONSTER))
		return;
	if (emitter->flags4 & MF4_INCOMBAT)
		return;
	emitter->flags4 |= MF4_INCOMBAT;

	emitter->target = target;
	FState *painstate = emitter->FindState(NAME_Pain, NAME_Dagger);
	if (painstate != NULL)
	{
		emitter->SetState(painstate);
	}

	for (looker = sec->thinglist; looker != NULL; looker = looker->snext)
	{
		if (looker == emitter || looker == target)
			continue;

		if (looker->health <= 0)
			continue;

		if (!(looker->flags4 & MF4_SEESDAGGERS))
			continue;

		if (!(looker->flags4 & MF4_INCOMBAT))
		{
			if (!P_CheckSight(looker, target) && !P_CheckSight(looker, emitter))
				continue;

			looker->target = target;
			if (looker->SeeSound)
			{
				S_Sound(looker, CHAN_VOICE, looker->SeeSound, 1, ATTN_NORM);
			}
			looker->SetState(looker->SeeState);
			looker->flags4 |= MF4_INCOMBAT;
		}
	}
}